

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpiabi_defn_functions_fortran.h
# Opt level: O0

void mpiabi_cart_get_(MPIABI_Fint *comm,MPIABI_Fint *maxdims,int *dims,int *periods,int *coords,
                     MPIABI_Fint *ierror)

{
  MPIABI_Fint *ierror_local;
  int *coords_local;
  int *periods_local;
  int *dims_local;
  MPIABI_Fint *maxdims_local;
  MPIABI_Fint *comm_local;
  
  mpi_cart_get_(comm,maxdims,dims,periods,coords,ierror);
  return;
}

Assistant:

void mpiabi_cart_get_(
  const MPIABI_Fint * comm,
  const MPIABI_Fint * maxdims,
  int * dims,
  int * periods,
  int * coords,
  MPIABI_Fint * ierror
) {
  return mpi_cart_get_(
    comm,
    maxdims,
    dims,
    periods,
    coords,
    ierror
  );
}